

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void internal_counters_set_lda(int nspin,xc_dimensions *dim)

{
  xc_dimensions *dim_local;
  int nspin_local;
  
  dim->vrho = nspin;
  dim->rho = nspin;
  dim->zk = 1;
  if (nspin == 1) {
    dim->v4rho4 = 1;
    dim->v3rho3 = 1;
    dim->v2rho2 = 1;
  }
  else {
    dim->v2rho2 = 3;
    dim->v3rho3 = 4;
    dim->v4rho4 = 5;
  }
  return;
}

Assistant:

void
internal_counters_set_lda(int nspin, xc_dimensions *dim)
{
  dim->rho = dim->vrho = nspin;
  dim->zk  = 1;
  if(nspin == XC_UNPOLARIZED){
    dim->v2rho2 = dim->v3rho3 = dim->v4rho4 = 1;
  }else{
    dim->v2rho2 = 3;
    dim->v3rho3 = 4;
    dim->v4rho4 = 5;
  }
}